

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float GetColumnWidthEx(ImGuiOldColumns *columns,int column_index,bool before_resize)

{
  ImGuiOldColumnData *pIVar1;
  byte in_DL;
  int in_ESI;
  ImGuiOldColumns *in_RDI;
  float fVar2;
  float offset_norm;
  float local_14;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    local_c = in_RDI->Current;
  }
  if ((in_DL & 1) == 0) {
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&in_RDI->Columns,local_c + 1);
    local_14 = pIVar1->OffsetNorm;
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&in_RDI->Columns,local_c);
    local_14 = local_14 - pIVar1->OffsetNorm;
  }
  else {
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&in_RDI->Columns,local_c + 1);
    local_14 = pIVar1->OffsetNormBeforeResize;
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&in_RDI->Columns,local_c);
    local_14 = local_14 - pIVar1->OffsetNormBeforeResize;
  }
  fVar2 = ImGui::GetColumnOffsetFromNorm(in_RDI,local_14);
  return fVar2;
}

Assistant:

static float GetColumnWidthEx(ImGuiOldColumns* columns, int column_index, bool before_resize = false)
{
    if (column_index < 0)
        column_index = columns->Current;

    float offset_norm;
    if (before_resize)
        offset_norm = columns->Columns[column_index + 1].OffsetNormBeforeResize - columns->Columns[column_index].OffsetNormBeforeResize;
    else
        offset_norm = columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm;
    return ImGui::GetColumnOffsetFromNorm(columns, offset_norm);
}